

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Version.cpp
# Opt level: O3

void __thiscall csm::Version::Version(Version *this,int major,int minor,int revision)

{
  iterator iVar1;
  Error *pEVar2;
  ErrorType local_80;
  int local_7c;
  int local_78;
  int local_74;
  string local_70;
  string local_50;
  
  (this->theVersions).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->theVersions).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->theVersions).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_7c = revision;
  local_78 = minor;
  local_74 = major;
  if (major < 0) {
    pEVar2 = (Error *)__cxa_allocate_exception(0x50);
    local_80 = BOUNDS;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"Invalid major version number","");
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"csm::Version::Version","");
    Error::Error(pEVar2,&local_80,&local_70,&local_50);
    __cxa_throw(pEVar2,&Error::typeinfo,Error::~Error);
  }
  if (-1 < minor) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)this,(iterator)0x0,&local_74);
    iVar1._M_current =
         (this->theVersions).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar1._M_current ==
        (this->theVersions).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)this,iVar1,&local_78);
    }
    else {
      *iVar1._M_current = minor;
      (this->theVersions).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar1._M_current + 1;
    }
    if (-1 < revision) {
      iVar1._M_current =
           (this->theVersions).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (this->theVersions).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)this,iVar1,&local_7c);
      }
      else {
        *iVar1._M_current = revision;
        (this->theVersions).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
    }
    return;
  }
  pEVar2 = (Error *)__cxa_allocate_exception(0x50);
  local_80 = BOUNDS;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"Invalid minor version number","");
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"csm::Version::Version","");
  Error::Error(pEVar2,&local_80,&local_70,&local_50);
  __cxa_throw(pEVar2,&Error::typeinfo,Error::~Error);
}

Assistant:

Version::Version(int major, int minor, int revision)
   :
      theVersions()
{
   static const char* const MODULE = "csm::Version::Version";

   if (major < 0)
   {
      throw Error(Error::BOUNDS, "Invalid major version number", MODULE);
   }
   if (minor < 0)
   {
      throw Error(Error::BOUNDS, "Invalid minor version number", MODULE);
   }

   theVersions.push_back(major);
   theVersions.push_back(minor);
   if (revision >= 0) theVersions.push_back(revision);
}